

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_key_encode_decode.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_a3d2::ARTKeyEncodeDecodeTest_Int64C00010_Test::
ARTKeyEncodeDecodeTest_Int64C00010_Test(ARTKeyEncodeDecodeTest_Int64C00010_Test *this)

{
  ARTKeyEncodeDecodeTest_Int64C00010_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__ARTKeyEncodeDecodeTest_Int64C00010_Test_001c7c58;
  return;
}

Assistant:

UNODB_TEST(ARTKeyEncodeDecodeTest, Int64C00010) {
  using T = std::int64_t;
  constexpr auto one = static_cast<T>(1);
  // Check the encoder byte order.
  constexpr std::array<const std::byte, sizeof(T)> ikey{
      static_cast<std::byte>(0x81), static_cast<std::byte>(0x02),
      static_cast<std::byte>(0x03), static_cast<std::byte>(0x04),
      static_cast<std::byte>(0x05), static_cast<std::byte>(0x06),
      static_cast<std::byte>(0x07), static_cast<std::byte>(0x08)};
  do_encode_decode_test<T>(0x0102030405060708LL, ikey);
  // round-trip tests.
  do_encode_decode_test(static_cast<T>(0));
  do_encode_decode_test(static_cast<T>(0 + 1));
  do_encode_decode_test(static_cast<T>(0 - 1));
  do_encode_decode_test(std::numeric_limits<T>::min());
  do_encode_decode_test(std::numeric_limits<T>::max());
  do_encode_decode_test(std::numeric_limits<T>::min() + one);
  do_encode_decode_test(std::numeric_limits<T>::max() - one);
  // check lexicographic ordering for std::uint64_t pairs.
  do_encode_decode_lt_test(static_cast<T>(0), static_cast<T>(1));
  do_encode_decode_lt_test(static_cast<T>(5), static_cast<T>(7));
  do_encode_decode_lt_test(std::numeric_limits<T>::min(),
                           std::numeric_limits<T>::min() + one);
  do_encode_decode_lt_test(std::numeric_limits<T>::max() - one,
                           std::numeric_limits<T>::max());
}